

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

_Bool evaluate_statement(Scope *scope,Statement *statement,_Bool print_if_not_null)

{
  StatementType SVar1;
  Value *pVVar2;
  char *__s;
  _Bool _Var3;
  
  SVar1 = statement->statement_type;
  if (SVar1 == StatementTypeReturnStatement) {
    pVVar2 = evaluate_expression(scope,*(Expression **)(statement + 2));
    scope_set_return_value(scope,pVVar2);
    _Var3 = false;
  }
  else {
    _Var3 = true;
    if (SVar1 == StatementTypeBlockDefinitionStatement) {
      evaluate_block_definition(scope,*(BlockDefinition **)(statement + 2));
    }
    else if (SVar1 == StatementTypeExpressionStatement) {
      pVVar2 = evaluate_expression(scope,*(Expression **)(statement + 2));
      if ((print_if_not_null) && (pVVar2->value_type != ValueTypeNullValue)) {
        __s = convert_to_string(pVVar2);
        puts(__s);
        free(__s);
      }
      free_value(pVVar2);
    }
  }
  return _Var3;
}

Assistant:

bool evaluate_statement(Scope *scope, Statement *statement, bool print_if_not_null) {

  switch (statement->statement_type) {
    case StatementTypeExpressionStatement: {
      Value *value = evaluate_expression(scope, ((ExpressionStatement *) statement)->expression);

      if (print_if_not_null && value->value_type != ValueTypeNullValue) {
        char *s = convert_to_string(value);
        printf("%s\n", s);
        free(s);
      }

      free_value(value);

      return true;
    }

    case StatementTypeReturnStatement: {
      scope_set_return_value(scope, evaluate_expression(scope, ((ReturnStatement *) statement)->right_expression));

      return false;
    }

    case StatementTypeImportStatement: {
      ImportStatement *import_statement = (ImportStatement *) statement;

      return true;
    }

    case StatementTypeBlockDefinitionStatement: {
      BlockDefinitionStatement *block_definition_statement = (BlockDefinitionStatement *) statement;

      BlockDefinition *block_definition = block_definition_statement->block_definition;

      evaluate_block_definition(scope, block_definition);

      return true;
    }

    default: {
      return true;
    }
  }
}